

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receptor.cpp
# Opt level: O0

void __thiscall indk::Neuron::Receptor::doUpdatePos(Receptor *this,Position *_RPos)

{
  reference ppPVar1;
  float fVar2;
  Position *_RPos_local;
  Receptor *this_local;
  
  if ((this->Locked & 1U) == 0) {
    ppPVar1 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::operator[]
                        (&this->ReferencePos,this->Scope);
    fVar2 = Position::getDistance(*ppPVar1,_RPos);
    this->L = fVar2 + this->L;
    ppPVar1 = std::vector<indk::Position_*,_std::allocator<indk::Position_*>_>::operator[]
                        (&this->ReferencePos,this->Scope);
    Position::doAdd(*ppPVar1,_RPos);
  }
  else {
    fVar2 = Position::getDistance(this->PhantomPos,_RPos);
    this->Lf = fVar2 + this->Lf;
    Position::doAdd(this->PhantomPos,_RPos);
  }
  return;
}

Assistant:

void indk::Neuron::Receptor::doUpdatePos(indk::Position *_RPos) {
    if (Locked) {
        Lf += indk::Position::getDistance(PhantomPos, _RPos);
        PhantomPos -> doAdd(_RPos);
    } else {
        L += indk::Position::getDistance(ReferencePos[Scope], _RPos);
        ReferencePos[Scope] -> doAdd(_RPos);
    }
}